

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_impl.hpp
# Opt level: O3

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
* __thiscall
toml::detail::region::as_lines_abi_cxx11_
          (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           *__return_storage_ptr__,region *this)

{
  element_type *peVar1;
  pointer puVar2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  end;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  begin;
  long *plVar3;
  pointer puVar4;
  const_iterator begin_00;
  long lVar5;
  long lVar6;
  const_iterator end_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  __l;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  __l_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  __l_01;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  __l_02;
  char_type lf;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  first_line;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  last_line;
  allocator_type local_102;
  undefined1 local_101;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *local_100;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_a8;
  long *local_80 [2];
  long local_70 [2];
  unsigned_long local_60;
  long *local_58 [2];
  long local_48 [2];
  unsigned_long local_38;
  
  if (this->length_ == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"",(allocator<char> *)&local_f8);
    local_a8.second = 0;
    __l_00._M_len = 1;
    __l_00._M_array = &local_a8;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::vector(__return_storage_ptr__,__l_00,(allocator_type *)&local_f8);
  }
  else {
    peVar1 = (this->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    lVar6 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    begin_00._M_current = (uchar *)(this->first_ + lVar6);
    end_00._M_current = (uchar *)(lVar6 + this->last_ + -1);
    if (this->first_line_ != this->last_line_) {
      puVar2 = (peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      puVar4 = begin_00._M_current + 0x32;
      if ((long)puVar2 - (long)begin_00._M_current < 0x3d) {
        puVar4 = puVar2;
      }
      lVar5 = this->last_ + lVar6 + -0x33;
      if ((long)end_00._M_current - lVar6 < 0x3d) {
        lVar5 = lVar6;
      }
      local_101 = 10;
      local_100 = __return_storage_ptr__;
      end = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                      (begin_00._M_current,puVar4,&local_101);
      begin = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                        (lVar5,end_00._M_current,&local_101);
      take_line_abi_cxx11_(&local_f8,this,begin_00,(const_iterator)end._M_current);
      take_line_abi_cxx11_(&local_d0,this,(const_iterator)begin._M_current,end_00);
      if (this->first_line_ + 1 == this->last_line_) {
        local_a8.first._M_dataplus._M_p = (pointer)&local_a8.first.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,local_f8.first._M_dataplus._M_p,
                   local_f8.first._M_dataplus._M_p + local_f8.first._M_string_length);
        __return_storage_ptr__ = local_100;
        local_a8.second = local_f8.second;
        plVar3 = local_70;
        local_80[0] = plVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_80,local_d0.first._M_dataplus._M_p,
                   local_d0.first._M_dataplus._M_p + local_d0.first._M_string_length);
        local_60 = local_d0.second;
        __l_01._M_len = 2;
        __l_01._M_array = &local_a8;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::vector(__return_storage_ptr__,__l_01,&local_102);
        lVar6 = -0x50;
        do {
          if (plVar3 != (long *)plVar3[-2]) {
            operator_delete((long *)plVar3[-2],*plVar3 + 1);
          }
          plVar3 = plVar3 + -5;
          lVar6 = lVar6 + 0x28;
        } while (lVar6 != 0);
      }
      else {
        local_a8.first._M_dataplus._M_p = (pointer)&local_a8.first.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,local_f8.first._M_dataplus._M_p,
                   local_f8.first._M_dataplus._M_p + local_f8.first._M_string_length);
        __return_storage_ptr__ = local_100;
        local_a8.second = local_f8.second;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_80,"...",(allocator<char> *)&local_102);
        local_60 = 0;
        plVar3 = local_48;
        local_58[0] = plVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_58,local_d0.first._M_dataplus._M_p,
                   local_d0.first._M_dataplus._M_p + local_d0.first._M_string_length);
        local_38 = local_d0.second;
        __l_02._M_len = 3;
        __l_02._M_array = &local_a8;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::vector(__return_storage_ptr__,__l_02,&local_102);
        lVar6 = -0x78;
        do {
          if (plVar3 != (long *)plVar3[-2]) {
            operator_delete((long *)plVar3[-2],*plVar3 + 1);
          }
          plVar3 = plVar3 + -5;
          lVar6 = lVar6 + 0x28;
        } while (lVar6 != 0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.first._M_dataplus._M_p != &local_d0.first.field_2) {
        operator_delete(local_d0.first._M_dataplus._M_p,
                        local_d0.first.field_2._M_allocated_capacity + 1);
      }
      local_a8.first.field_2._M_allocated_capacity = local_f8.first.field_2._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.first._M_dataplus._M_p == &local_f8.first.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_001db26f;
    }
    take_line_abi_cxx11_(&local_a8,this,begin_00,end_00);
    __l._M_len = 1;
    __l._M_array = &local_a8;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::vector(__return_storage_ptr__,__l,(allocator_type *)&local_f8);
  }
  local_f8.first._M_dataplus._M_p = local_a8.first._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.first._M_dataplus._M_p == &local_a8.first.field_2) {
    return __return_storage_ptr__;
  }
LAB_001db26f:
  operator_delete(local_f8.first._M_dataplus._M_p,local_a8.first.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::vector<std::pair<std::string, std::size_t>> region::as_lines() const
{
    assert(this->is_ok());
    if(this->length_ == 0)
    {
        return std::vector<std::pair<std::string, std::size_t>>{
            std::make_pair("", std::size_t(0))
        };
    }

    // Consider the following toml file
    // ```
    // array = [
    //   1, 2, 3,
    // ] # comment
    // ```
    // and the region represnets
    // ```
    //         [
    //   1, 2, 3,
    // ]
    // ```
    // but we want to show the following.
    // ```
    // array = [
    //   1, 2, 3,
    // ] # comment
    // ```
    // So we need to find LFs before `begin` and after `end`.
    //
    // But, if region ends with LF, it should not include the next line.
    // ```
    // a = 42
    //     ^^^- with the last LF
    // ```
    // So we start from `end-1` when looking for LF.

    const auto begin_idx = static_cast<difference_type>(this->first_);
    const auto end_idx   = static_cast<difference_type>(this->last_) - 1;

    // length_ != 0, so begin < end. then begin <= end-1
    assert(begin_idx <= end_idx);

    const auto begin = std::next(this->source_->cbegin(), begin_idx);
    const auto end   = std::next(this->source_->cbegin(), end_idx);

    assert(this->first_line_number() <= this->last_line_number());

    if(this->first_line_number() == this->last_line_number())
    {
        return std::vector<std::pair<std::string, std::size_t>>{
            this->take_line(begin, end)
        };
    }

    // we have multiple lines. `begin` and `end` points different lines.
    // that means that there is at least one `LF` between `begin` and `end`.

    const auto after_begin = std::distance(begin, this->source_->cend());
    const auto before_end  = std::distance(this->source_->cbegin(), end);

    const_iterator capped_file_end   = this->source_->cend();
    const_iterator capped_file_begin = this->source_->cbegin();
    if(60 < after_begin) {capped_file_end   = std::next(begin, 50);}
    if(60 < before_end)  {capped_file_begin = std::prev(end,   50);}

    const auto lf = char_type('\n');
    const auto first_line_end  = std::find(begin, capped_file_end, lf);
    const auto last_line_begin = std::find(capped_file_begin, end, lf);

    const auto first_line = this->take_line(begin, first_line_end);
    const auto last_line  = this->take_line(last_line_begin, end);

    if(this->first_line_number() + 1 == this->last_line_number())
    {
        return std::vector<std::pair<std::string, std::size_t>>{
            first_line, last_line
        };
    }
    else
    {
        return std::vector<std::pair<std::string, std::size_t>>{
            first_line, std::make_pair("...", 0), last_line
        };
    }
}